

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O1

void __thiscall GeneticAlgorithm::run(GeneticAlgorithm *this)

{
  ulong uVar1;
  Population p;
  vector<Chromosome,_std::allocator<Chromosome>_> local_c8;
  Population local_a8;
  Population local_68;
  
  Population::Population(&local_a8,params.populationSize);
  Population::process(&local_a8);
  std::vector<Population,_std::allocator<Population>_>::push_back(&this->generations,&local_a8);
  for (uVar1 = 0; uVar1 < params.generations; uVar1 = uVar1 + 1) {
    Population::tournament_selection(&local_68,&local_a8,(int)uVar1 + 1);
    local_c8.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_c8.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_c8.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_a8.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_a8._20_8_ = local_68._20_8_;
    local_a8.minFitness = local_68.minFitness;
    local_a8.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_a8.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_a8.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_68.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_c8);
    std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_68.chromosomes);
    Population::crossover_selection(&local_a8,params.crossoverPercent);
    Population::mutation(&local_a8,params.mutationPercent);
    Population::process(&local_a8);
    Population::calcDiversity(&local_a8);
    std::vector<Population,_std::allocator<Population>_>::push_back(&this->generations,&local_a8);
  }
  Population::printBestCandidate
            ((this->generations).super__Vector_base<Population,_std::allocator<Population>_>._M_impl
             .super__Vector_impl_data._M_finish + -1);
  resultAsJson(this);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_a8.chromosomes);
  return;
}

Assistant:

void GeneticAlgorithm::run() {


    Population p = createBasePopulation();
    p.process();
    generations.push_back(p);

    double fitness = 0.001;
    int generation = 0;

    while(generation < params.generations){
        //p.printChromos();
        generation++;
        p = p.tournament_selection(generation);
        p.crossover_selection(params.crossoverPercent);
        p.mutation(params.mutationPercent);
        p.process();

        p.calcDiversity();
        //p.printBestCandidate();
       // std::cout << "Min Fitness: " << p.minFitness << std::endl;
       // std::cout << "Max Fitness: " << p.maxFitness << std::endl;

        generations.push_back(p);
     }

    generations.back().printBestCandidate();

    //resultToFile();
    resultAsJson();
}